

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

Gia_Man_t *
Gia_ManFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  byte bVar1;
  char cVar2;
  Vec_Int_t *pVVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  Ses_Man_t *pSes;
  char *__ptr;
  Gia_Man_t *p;
  char *pcVar11;
  Vec_Int_t *p_00;
  Vec_Ptr_t *vNames;
  Vec_Ptr_t *pVVar12;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  ulong uVar15;
  abctime aVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  byte *pbVar20;
  
  if (6 < nVars - 2U) {
    __assert_fail("nVars >= 2 && nVars <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x99a,"Gia_Man_t *Gia_ManFindExact(word *, int, int, int, int *, int, int, int)")
    ;
  }
  aVar10 = Abc_Clock();
  pSes = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,1,nBTLimit,fVerbose);
  pSes->nStartGates = nStartGates;
  pSes->fVeryVerbose = 1;
  pSes->fExtractVerbose = 0;
  pSes->fSatVerbose = 0;
  pSes->fReasonVerbose = 1;
  if (fVerbose != 0) {
    Ses_ManPrintFuncs(pSes);
  }
  __ptr = Ses_ManFindMinimumSize(pSes);
  iVar18 = 0;
  if (__ptr == (char *)0x0) {
    p = (Gia_Man_t *)0x0;
  }
  else {
    p = Gia_ManStart((int)__ptr[1] + (int)__ptr[2] + (int)*__ptr + 1);
    p->nConstrs = 0;
    pcVar11 = Extra_UtilStrsav("exact");
    p->pName = pcVar11;
    p_00 = Vec_IntAlloc((int)__ptr[2] + (int)*__ptr);
    vNames = Abc_NodeGetFakeNames((int)__ptr[1] + (int)*__ptr);
    pVVar12 = Vec_PtrStart((int)*__ptr);
    p->vNamesIn = pVVar12;
    for (; iVar18 < *__ptr; iVar18 = iVar18 + 1) {
      pGVar13 = Gia_ManAppendObj(p);
      uVar15 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pVVar3 = p->vCis;
      iVar5 = Gia_ObjId(p,pGVar13);
      Vec_IntPush(pVVar3,iVar5);
      iVar5 = Gia_ObjId(p,pGVar13);
      Vec_IntPush(p_00,iVar5 * 2);
      pVVar12 = p->vNamesIn;
      pcVar11 = (char *)Vec_PtrEntry(vNames,iVar18);
      pcVar11 = Extra_UtilStrsav(pcVar11);
      Vec_PtrSetEntry(pVVar12,iVar18,pcVar11);
    }
    pbVar20 = (byte *)(__ptr + 3);
    for (iVar18 = 0; iVar18 < __ptr[2]; iVar18 = iVar18 + 1) {
      if (pbVar20[1] != 2) {
        __assert_fail("p[1] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0x73f,"Gia_Man_t *Ses_ManExtractGia(const char *)");
      }
      uVar6 = Vec_IntEntry(p_00,(int)(char)pbVar20[2]);
      uVar7 = Vec_IntEntry(p_00,(int)(char)pbVar20[3]);
      bVar1 = *pbVar20;
      bVar4 = bVar1;
      if ((bVar1 & 1) != 0) {
        uVar6 = Abc_LitNot(uVar6);
        bVar4 = *pbVar20;
      }
      if ((bVar4 & 2) != 0) {
        uVar7 = Abc_LitNot(uVar7);
      }
      pGVar13 = Gia_ManAppendObj(p);
      if (((int)uVar6 < 0) || (iVar5 = Abc_Lit2Var(uVar6), p->nObjs <= iVar5)) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if (((int)uVar7 < 0) || (iVar5 = Abc_Lit2Var(uVar7), p->nObjs <= iVar5)) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if (p->fGiaSimple == 0) {
        iVar5 = Abc_Lit2Var(uVar6);
        iVar8 = Abc_Lit2Var(uVar7);
        if (iVar5 == iVar8) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
      }
      iVar5 = Gia_ObjId(p,pGVar13);
      iVar8 = Abc_Lit2Var(uVar6);
      uVar15 = (ulong)(iVar5 - iVar8 & 0x1fffffff);
      if (uVar6 < uVar7) {
        *(ulong *)pGVar13 = *(ulong *)pGVar13 & 0xffffffffe0000000 | uVar15;
        iVar5 = Abc_LitIsCompl(uVar6);
        *(ulong *)pGVar13 = *(ulong *)pGVar13 & 0xffffffffdfffffff | (ulong)(uint)(iVar5 << 0x1d);
        iVar5 = Gia_ObjId(p,pGVar13);
        iVar8 = Abc_Lit2Var(uVar7);
        *(ulong *)pGVar13 =
             *(ulong *)pGVar13 & 0xe0000000ffffffff | (ulong)(iVar5 - iVar8 & 0x1fffffff) << 0x20;
        uVar7 = Abc_LitIsCompl(uVar7);
        uVar14 = (ulong)uVar7 << 0x3d;
        uVar15 = *(ulong *)pGVar13;
        uVar17 = 0xdfffffffffffffff;
      }
      else {
        *(ulong *)pGVar13 = *(ulong *)pGVar13 & 0xe0000000ffffffff | uVar15 << 0x20;
        uVar6 = Abc_LitIsCompl(uVar6);
        *(ulong *)pGVar13 = *(ulong *)pGVar13 & 0xdfffffffffffffff | (ulong)uVar6 << 0x3d;
        iVar5 = Gia_ObjId(p,pGVar13);
        iVar8 = Abc_Lit2Var(uVar7);
        *(ulong *)pGVar13 =
             *(ulong *)pGVar13 & 0xffffffffe0000000 | (ulong)(iVar5 - iVar8 & 0x1fffffff);
        iVar5 = Abc_LitIsCompl(uVar7);
        uVar14 = (ulong)(uint)(iVar5 << 0x1d);
        uVar15 = *(ulong *)pGVar13;
        uVar17 = 0xffffffffdfffffff;
      }
      *(ulong *)pGVar13 = uVar15 & uVar17 | uVar14;
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar13 + -(uVar15 & uVar17 & 0x1fffffff),pGVar13);
        Gia_ObjAddFanout(p,pGVar13 + -((ulong)*(uint *)&pGVar13->field_0x4 & 0x1fffffff),pGVar13);
      }
      if (p->fSweeper != 0) {
        uVar14 = *(ulong *)pGVar13 & 0x1fffffff;
        uVar15 = *(ulong *)pGVar13 >> 0x20 & 0x1fffffff;
        uVar17 = 0x4000000000000000;
        if (((uint)*(ulong *)(pGVar13 + -uVar14) >> 0x1e & 1) == 0) {
          uVar17 = 0x40000000;
        }
        *(ulong *)(pGVar13 + -uVar14) = uVar17 | *(ulong *)(pGVar13 + -uVar14);
        uVar17 = *(ulong *)(pGVar13 + -uVar15);
        uVar19 = 0x4000000000000000;
        if (((uint)uVar17 >> 0x1e & 1) == 0) {
          uVar19 = 0x40000000;
        }
        *(ulong *)(pGVar13 + -uVar15) = uVar19 | uVar17;
        uVar15 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 =
             uVar15 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar15 >> 0x3d) ^ (uint)(uVar17 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pGVar13 + -uVar14) >> 0x3f) ^
                    (uint)(uVar15 >> 0x1d) & 7)) << 0x3f;
      }
      if (p->fBuiltInSim != 0) {
        uVar15 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 =
             uVar15 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar15 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pGVar13 + -(uVar15 >> 0x20 & 0x1fffffff)) >> 0x3f
                           )) &
                    ((uint)((ulong)*(undefined8 *)(pGVar13 + -(uVar15 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar15 >> 0x1d) & 7)) << 0x3f;
        iVar5 = Gia_ObjId(p,pGVar13);
        Gia_ManBuiltInSimPerform(p,iVar5);
      }
      if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(p,pGVar13);
      }
      iVar5 = Gia_ObjId(p,pGVar13);
      iVar5 = iVar5 * 2;
      if ((bVar1 & 1) != 0 && (bVar4 & 2) != 0) {
        if ((*pbVar20 & 4) == 0) {
          __assert_fail("( *p >> 2 ) & 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0x751,"Gia_Man_t *Ses_ManExtractGia(const char *)");
        }
        iVar5 = Abc_LitNot(iVar5);
      }
      Vec_IntPush(p_00,iVar5);
      pbVar20 = pbVar20 + 4;
    }
    pVVar12 = Vec_PtrStart((int)__ptr[1]);
    p->vNamesOut = pVVar12;
    for (iVar18 = 0; iVar18 < __ptr[1]; iVar18 = iVar18 + 1) {
      cVar2 = *__ptr;
      iVar5 = Abc_Lit2Var((int)(char)*pbVar20);
      iVar8 = Vec_IntEntry(p_00,cVar2 + iVar5);
      iVar5 = Abc_LitIsCompl((int)(char)*pbVar20);
      if (iVar5 == 0) {
        if (iVar8 < 0) goto LAB_00281ffe;
      }
      else {
        iVar8 = Abc_LitNot(iVar8);
      }
      iVar5 = Abc_Lit2Var(iVar8);
      if (p->nObjs <= iVar5) {
LAB_00281ffe:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      iVar5 = Abc_Lit2Var(iVar8);
      pGVar13 = Gia_ManObj(p,iVar5);
      if ((~*(uint *)pGVar13 & 0x1fffffff) != 0 && (int)*(uint *)pGVar13 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar13 = Gia_ManAppendObj(p);
      *(ulong *)pGVar13 = *(ulong *)pGVar13 | 0x80000000;
      iVar5 = Gia_ObjId(p,pGVar13);
      iVar9 = Abc_Lit2Var(iVar8);
      *(ulong *)pGVar13 =
           *(ulong *)pGVar13 & 0xffffffffe0000000 | (ulong)(iVar5 - iVar9 & 0x1fffffff);
      iVar5 = Abc_LitIsCompl(iVar8);
      uVar15 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar15 & 0xffffffffdfffffff | (ulong)(uint)(iVar5 << 0x1d);
      *(ulong *)pGVar13 =
           uVar15 & 0xe0000000dfffffff | (ulong)(uint)(iVar5 << 0x1d) |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pVVar3 = p->vCos;
      iVar5 = Gia_ObjId(p,pGVar13);
      Vec_IntPush(pVVar3,iVar5);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),pGVar13);
      }
      Gia_ObjId(p,pGVar13);
      pVVar12 = p->vNamesOut;
      pcVar11 = (char *)Vec_PtrEntry(vNames,*__ptr + iVar18);
      pcVar11 = Extra_UtilStrsav(pcVar11);
      Vec_PtrSetEntry(pVVar12,iVar18,pcVar11);
      pbVar20 = pbVar20 + (long)*__ptr + 2;
    }
    Abc_NodeFreeNames(vNames);
    Vec_IntFree(p_00);
    free(__ptr);
  }
  aVar16 = Abc_Clock();
  pSes->timeTotal = aVar16 - aVar10;
  if (fVerbose != 0) {
    Ses_ManPrintRuntime(pSes);
  }
  Ses_ManClean(pSes);
  return p;
}

Assistant:

Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Gia_Man_t * pGia = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 1, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fVeryVerbose = 1;
    pSes->fExtractVerbose = 0;
    pSes->fSatVerbose = 0;
    pSes->fReasonVerbose = 1;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pGia = Ses_ManExtractGia( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pGia;
}